

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::JSONReactor::~JSONReactor(JSONReactor *this)

{
  (this->super_Reactor)._vptr_Reactor = (_func_int **)&PTR__JSONReactor_002b0a60;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->next_obj).super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
  ~vector(&this->stack);
  std::__cxx11::string::~string((string *)&this->cur_object);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->descr).
              super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~JSONReactor() override = default;